

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

bool Input::getMouse(int button)

{
  Input *pIVar1;
  
  pIVar1 = getInstance();
  return pIVar1->mouse[button];
}

Assistant:

bool Input::getMouse(int button)
{
	return Input::getInstance()->mouse[button];
}